

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O2

void __thiscall xe::xml::Parser::parseEntityValue(Parser *this)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  long lVar4;
  Parser *this_00;
  string entity;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  
  entity._M_dataplus._M_p = (pointer)&entity.field_2;
  entity._M_string_length = 0;
  entity.field_2._M_local_buf[0] = '\0';
  Tokenizer::getTokenStr(&this->m_tokenizer,&entity);
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar4 + 0x10 == 0x60) goto LAB_001146be;
    bVar3 = std::operator==(&entity,*(char **)((long)&getEntityValue(std::__cxx11::string_const&)::
                                                      s_entities + lVar4));
    lVar2 = lVar4 + 0x10;
  } while (!bVar3);
  cVar1 = (&DAT_00120cf8)[lVar4];
  if (cVar1 != '\0') {
    std::__cxx11::string::resize((ulong)&this->m_entityValue);
    *(this->m_entityValue)._M_dataplus._M_p = cVar1;
    std::__cxx11::string::~string((string *)&entity);
    return;
  }
LAB_001146be:
  std::operator+(&local_68,"Invalid entity \'",&entity);
  this_00 = (Parser *)&stack0xffffffffffffffb8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_68,"\'");
  error(this_00,(string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&entity);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::parseEntityValue (void)
{
	DE_ASSERT(m_state == STATE_ENTITY && m_tokenizer.getToken() == TOKEN_ENTITY);

	std::string entity;
	m_tokenizer.getTokenStr(entity);

	const char value = getEntityValue(entity);
	if (value == 0)
		error("Invalid entity '" + entity + "'");

	m_entityValue.resize(1);
	m_entityValue[0] = value;
}